

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yssimplesound_linux_alsa.cpp
# Opt level: O2

YSRESULT __thiscall YsSoundPlayer::APISpecificData::Start(APISpecificData *this)

{
  snd_pcm_t **ppsVar1;
  uint uVar2;
  uint uVar3;
  snd_pcm_t *psVar4;
  snd_pcm_hw_params_t *psVar5;
  undefined8 uVar6;
  snd_pcm_uframes_t sVar7;
  int i;
  int iVar8;
  long lVar9;
  size_t __n;
  uchar *puVar10;
  ulong uVar11;
  char *__s;
  uint uVar12;
  YSRESULT YVar13;
  undefined8 uStack_40;
  snd_pcm_hw_params_t asStack_38 [8];
  undefined4 local_30;
  undefined1 local_2c [4];
  uint request;
  int dir;
  
  ppsVar1 = &this->handle;
  uStack_40 = 0x113770;
  iVar8 = snd_pcm_open(ppsVar1,"default",0,1);
  if (iVar8 < 0) {
    uStack_40 = 0x11390d;
    puts("Cannot open PCM device.");
    *ppsVar1 = (snd_pcm_t *)0x0;
    YVar13 = YSERR;
  }
  else {
    uStack_40 = 0x11377d;
    lVar9 = snd_pcm_hw_params_sizeof();
    lVar9 = -(lVar9 + 0xfU & 0xfffffffffffffff0);
    this->hwParam = asStack_38 + lVar9;
    *(undefined8 *)(asStack_38 + lVar9 + -8) = 0x113797;
    __n = snd_pcm_hw_params_sizeof();
    *(undefined8 *)(asStack_38 + lVar9 + -8) = 0x1137a4;
    memset(asStack_38 + lVar9,0,__n);
    psVar4 = this->handle;
    psVar5 = this->hwParam;
    *(undefined8 *)(asStack_38 + lVar9 + -8) = 0x1137b1;
    snd_pcm_hw_params_any(psVar4,psVar5);
    psVar4 = this->handle;
    psVar5 = this->hwParam;
    *(undefined8 *)(asStack_38 + lVar9 + -8) = 3;
    uVar6 = *(undefined8 *)(asStack_38 + lVar9 + -8);
    *(undefined8 *)(asStack_38 + lVar9 + -8) = 0x1137c1;
    snd_pcm_hw_params_set_access(psVar4,psVar5,uVar6);
    psVar4 = this->handle;
    psVar5 = this->hwParam;
    *(undefined8 *)(asStack_38 + lVar9 + -8) = 2;
    uVar6 = *(undefined8 *)(asStack_38 + lVar9 + -8);
    *(undefined8 *)(asStack_38 + lVar9 + -8) = 0x1137d1;
    snd_pcm_hw_params_set_format(psVar4,psVar5,uVar6);
    psVar4 = this->handle;
    psVar5 = this->hwParam;
    *(undefined8 *)(asStack_38 + lVar9 + -8) = 1;
    uVar11 = *(ulong *)(asStack_38 + lVar9 + -8);
    YVar13 = (YSRESULT)uVar11;
    *(undefined8 *)(asStack_38 + lVar9 + -8) = 0x1137e5;
    snd_pcm_hw_params_set_channels(psVar4,psVar5,uVar11 & 0xffffffff);
    local_30 = 8000;
    psVar4 = this->handle;
    psVar5 = this->hwParam;
    *(undefined8 *)(asStack_38 + lVar9 + -8) = 0x113800;
    snd_pcm_hw_params_set_rate_near(psVar4,psVar5,&local_30,local_2c);
    psVar4 = this->handle;
    psVar5 = this->hwParam;
    *(undefined8 *)(asStack_38 + lVar9 + -8) = 0x11380d;
    iVar8 = snd_pcm_hw_params(psVar4,psVar5);
    if (iVar8 < 0) {
      __s = "Cannot set hardward parameters.";
      YVar13 = YSERR;
    }
    else {
      psVar5 = this->hwParam;
      *(undefined8 *)(asStack_38 + lVar9 + -8) = 0x113822;
      snd_pcm_hw_params_get_channels(psVar5,&this->nChannel);
      psVar5 = this->hwParam;
      *(undefined8 *)(asStack_38 + lVar9 + -8) = 0x113836;
      snd_pcm_hw_params_get_rate(psVar5,&this->rate,local_2c);
      psVar5 = this->hwParam;
      *(undefined8 *)(asStack_38 + lVar9 + -8) = 0x113846;
      snd_pcm_hw_params_get_period_size(psVar5,&this->nPeriod,local_2c);
      psVar5 = this->hwParam;
      *(undefined8 *)(asStack_38 + lVar9 + -8) = 0x113853;
      snd_pcm_hw_params_get_buffer_size(psVar5,&this->bufSize);
      uVar12 = this->nChannel;
      uVar2 = this->rate;
      sVar7 = this->nPeriod;
      uVar3 = this->bufSize;
      *(undefined8 *)(asStack_38 + lVar9 + -8) = 0x113871;
      printf("%d channels, %d Hz, %d periods, %d frames buffer.\n",(ulong)uVar12,(ulong)uVar2,
             (ulong)(uint)sVar7,(ulong)uVar3);
      uVar12 = (int)this->nPeriod * 4;
      this->bufSizeInNStep = uVar12;
      uVar12 = uVar12 * this->bytePerTimeStep;
      this->bufSizeInByte = uVar12;
      puVar10 = this->writeBuf;
      if (puVar10 != (uchar *)0x0) {
        *(undefined8 *)(asStack_38 + lVar9 + -8) = 0x113894;
        operator_delete__(puVar10);
        uVar12 = this->bufSizeInByte;
      }
      *(undefined8 *)(asStack_38 + lVar9 + -8) = 0x1138a0;
      puVar10 = (uchar *)operator_new__((ulong)uVar12);
      this->writeBuf = puVar10;
      for (uVar11 = 0; uVar11 < uVar12; uVar11 = uVar11 + 1) {
        this->writeBuf[uVar11] = '\0';
        uVar12 = this->bufSizeInByte;
      }
      psVar4 = *ppsVar1;
      *(undefined8 *)(asStack_38 + lVar9 + -8) = 0x1138c7;
      snd_pcm_prepare(psVar4);
      psVar4 = *ppsVar1;
      *(undefined8 *)(asStack_38 + lVar9 + -8) = 0x1138d4;
      iVar8 = snd_pcm_wait(psVar4,1000);
      if (iVar8 == 0) {
        *(undefined8 *)(asStack_38 + lVar9 + -8) = 0x1138e4;
        puts("snd_pcm_wait timed out.");
        *(undefined8 *)(asStack_38 + lVar9 + -8) = 0x1138f0;
        puts("There may be no sound.");
      }
      psVar4 = *ppsVar1;
      *(undefined8 *)(asStack_38 + lVar9 + -8) = 0x1138f8;
      snd_pcm_start(psVar4);
      __s = "YsSoundPlayer started.";
    }
    *(undefined8 *)(asStack_38 + lVar9 + -8) = 0x113925;
    puts(__s);
  }
  return YVar13;
}

Assistant:

YSRESULT YsSoundPlayer::APISpecificData::Start(void)
{
	int res=snd_pcm_open(&handle,"default",SND_PCM_STREAM_PLAYBACK,SND_PCM_NONBLOCK);
	if(0>res)
	{
		printf("Cannot open PCM device.\n");
		handle=nullptr;
		return YSERR;
	}

	snd_pcm_hw_params_alloca(&hwParam);
	snd_pcm_hw_params_any(handle,hwParam);
	snd_pcm_hw_params_set_access(handle,hwParam,SND_PCM_ACCESS_RW_INTERLEAVED);
	snd_pcm_hw_params_set_format(handle,hwParam,SND_PCM_FORMAT_S16_LE);
	snd_pcm_hw_params_set_channels(handle,hwParam,1);

	unsigned int request=8000;//22050;
	int dir;  // What's dir?
	snd_pcm_hw_params_set_rate_near(handle,hwParam,&request,&dir);

	if(0>snd_pcm_hw_params(handle,hwParam))
	{
		printf("Cannot set hardward parameters.\n");
		return YSERR;
	}

	snd_pcm_hw_params_get_channels(hwParam,&nChannel);
	snd_pcm_hw_params_get_rate(hwParam,&rate,&dir);
	snd_pcm_hw_params_get_period_size(hwParam,&nPeriod,&dir);
	snd_pcm_hw_params_get_buffer_size(hwParam,(snd_pcm_uframes_t *)&bufSize);
	printf("%d channels, %d Hz, %d periods, %d frames buffer.\n",
		   nChannel,rate,(int)nPeriod,(int)bufSize);

	bufSizeInNStep=nPeriod*4;
	bufSizeInByte=bufSizeInNStep*bytePerTimeStep;
	if(nullptr!=writeBuf)
	{
		delete [] writeBuf;
	}
	writeBuf=new unsigned char [bufSizeInByte];
	for(int i=0; i<bufSizeInByte; ++i)
	{
		writeBuf[i]=0;
	}

	// snd_pcm_sw_params_alloca(&swParam);
	// snd_async_add_pcm_handler(&asyncHandler,handle,KeepPlayingCallBack,this);


	snd_pcm_prepare(handle);
	if(0==snd_pcm_wait(handle,1000))
	{
		printf("snd_pcm_wait timed out.\n");
		printf("There may be no sound.\n");
	}
	snd_pcm_start(handle);

	printf("YsSoundPlayer started.\n");

	return YSOK;
}